

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O3

void __thiscall
iDynTree::GravityCompensationHelper::allocKinematicTraversals
          (GravityCompensationHelper *this,size_t nrOfLinks)

{
  Traversal *this_00;
  ulong uVar1;
  
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::resize
            (&this->m_kinematicTraversals,nrOfLinks);
  if ((this->m_kinematicTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_kinematicTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      this_00 = (Traversal *)operator_new(0x60);
      iDynTree::Traversal::Traversal(this_00);
      (this->m_kinematicTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = this_00;
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(this->m_kinematicTraversals).
                                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_kinematicTraversals).
                                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void GravityCompensationHelper::allocKinematicTraversals(const size_t nrOfLinks)
  {
    m_kinematicTraversals.resize(nrOfLinks);
    for (size_t link = 0; link < m_kinematicTraversals.size(); link++)
    {
      m_kinematicTraversals[link] = new iDynTree::Traversal;
    }
  }